

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageCount(Fts5Storage *p,char *zSuffix,i64 *pnRow)

{
  int iVar1;
  sqlite3 *psVar2;
  sqlite3_stmt *local_40;
  sqlite3_stmt *pCnt;
  char *pcStack_30;
  int rc;
  char *zSql;
  Fts5Config *pConfig;
  i64 *pnRow_local;
  char *zSuffix_local;
  Fts5Storage *p_local;
  
  zSql = (char *)p->pConfig;
  pConfig = (Fts5Config *)pnRow;
  pnRow_local = (i64 *)zSuffix;
  zSuffix_local = (char *)p;
  pcStack_30 = sqlite3_mprintf("SELECT count(*) FROM %Q.\'%q_%s\'",((Fts5Config *)zSql)->zDb,
                               ((Fts5Config *)zSql)->zName,zSuffix);
  if (pcStack_30 == (char *)0x0) {
    pCnt._4_4_ = 7;
  }
  else {
    local_40 = (sqlite3_stmt *)0x0;
    pCnt._4_4_ = sqlite3_prepare_v2(*(sqlite3 **)zSql,pcStack_30,-1,&local_40,(char **)0x0);
    if (pCnt._4_4_ == 0) {
      iVar1 = sqlite3_step(local_40);
      if (iVar1 == 100) {
        psVar2 = (sqlite3 *)sqlite3_column_int64(local_40,0);
        pConfig->db = psVar2;
      }
      pCnt._4_4_ = sqlite3_finalize(local_40);
    }
  }
  sqlite3_free(pcStack_30);
  return pCnt._4_4_;
}

Assistant:

static int fts5StorageCount(Fts5Storage *p, const char *zSuffix, i64 *pnRow){
  Fts5Config *pConfig = p->pConfig;
  char *zSql;
  int rc;

  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.'%q_%s'", 
      pConfig->zDb, pConfig->zName, zSuffix
  );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_stmt *pCnt = 0;
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &pCnt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pCnt) ){
        *pnRow = sqlite3_column_int64(pCnt, 0);
      }
      rc = sqlite3_finalize(pCnt);
    }
  }

  sqlite3_free(zSql);
  return rc;
}